

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

PSNode * dg::pta::PointerAnalysisFSInv::moFromFreeToOverwrite(PSNode *operand)

{
  bool bVar1;
  PSNodeType PVar2;
  PSNode *this;
  Pointer PVar3;
  PSNode *loadOp;
  PSNode *strippedOp;
  const_iterator *in_stack_ffffffffffffffb8;
  SubgraphNode<dg::pta::PSNode> *in_stack_ffffffffffffffc0;
  PSNode *local_30;
  
  bVar1 = PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x164aba);
  if (!bVar1) {
    this = PSNode::stripCasts((PSNode *)in_stack_ffffffffffffffc0);
    PVar2 = PSNode::getType(this);
    if (PVar2 == LOAD) {
      SubgraphNode<dg::pta::PSNode>::getOperand
                (in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
      bVar1 = invStrongUpdate(this);
      if (bVar1) {
        PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffffc0);
        PVar3 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffffb8);
        local_30 = PVar3.target;
        return local_30;
      }
    }
  }
  return (PSNode *)0x0;
}

Assistant:

static PSNode *moFromFreeToOverwrite(PSNode *operand) {
        // Bail out if the operand has no pointers yet,
        // otherwise we can add invalidated imprecisely
        // (the rest of invalidateMemory would not perform strong update)
        if (operand->pointsTo.empty())
            return nullptr;

        // invalidate(p) translates to
        //  1 = load x
        //  ...
        //  invalidate(1)
        // Get objects where x may point to. If this object is only one,
        // then we know that this object will point to invalid memory
        // (no what is its state).
        PSNode *strippedOp = operand->stripCasts();
        if (strippedOp->getType() == PSNodeType::LOAD) {
            // get the pointer to the memory that holds the pointers
            // that are being freed
            PSNode *loadOp = strippedOp->getOperand(0);
            if (invStrongUpdate(loadOp)) {
                return (*(loadOp->pointsTo.begin())).target;
            }
        }

        return nullptr;
    }